

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O3

void m_dowear(level *lev,monst *mon,boolean creation)

{
  obj *poVar1;
  boolean bVar2;
  permonst *ppVar3;
  
  ppVar3 = mon->data;
  if (((ppVar3->msize == '\0') || ((ppVar3->mflags1 & 0x42000) != 0)) ||
     (((ppVar3->mflags1 >> 0x10 & 1) != 0 &&
      ((creation == '\0' || (ppVar3 != mons + 0xfe && ppVar3->mlet != '\'')))))) {
    return;
  }
  m_dowear_type(lev,mon,0x10000,creation,'\0');
  bVar2 = breakarm(mon->data);
  if (bVar2 == '\0') {
    bVar2 = sliparm(mon->data);
    if (bVar2 != '\0') goto LAB_0028cd53;
LAB_0028cd59:
    m_dowear_type(lev,mon,0x40,creation,'\0');
  }
  else {
LAB_0028cd53:
    if ((mon->misc_worn_check & 1) != 0) goto LAB_0028cd59;
  }
  bVar2 = breakarm(mon->data);
  if (bVar2 == '\0') {
    bVar2 = sliparm(mon->data);
    if (bVar2 != '\0') goto LAB_0028cd88;
LAB_0028cd92:
    m_dowear_type(lev,mon,2,creation,'\0');
  }
  else {
LAB_0028cd88:
    if (mon->data->msize == '\x01') goto LAB_0028cd92;
  }
  m_dowear_type(lev,mon,4,creation,'\0');
  poVar1 = mon->mw;
  if ((((poVar1 == (obj *)0x0) || ((byte)(poVar1->oclass | 4U) != 6)) ||
      ((objects[poVar1->otyp].field_0x11 & 1) == 0)) || (mon->data == mons + 0x11b)) {
    m_dowear_type(lev,mon,8,creation,'\0');
  }
  m_dowear_type(lev,mon,0x10,creation,'\0');
  ppVar3 = mon->data;
  if (((ppVar3->mflags1 & 0x80000) == 0) && (ppVar3->mlet != '\x1d')) {
    m_dowear_type(lev,mon,0x20,creation,'\0');
    ppVar3 = mon->data;
  }
  bVar2 = breakarm(ppVar3);
  if (bVar2 == '\0') {
    bVar2 = sliparm(mon->data);
    if (bVar2 == '\0') {
      bVar2 = '\0';
      goto LAB_0028ce68;
    }
  }
  bVar2 = '\x01';
LAB_0028ce68:
  m_dowear_type(lev,mon,1,creation,bVar2);
  return;
}

Assistant:

void m_dowear(struct level *lev, struct monst *mon, boolean creation)
{
#define RACE_EXCEPTION TRUE
	/* Note the restrictions here are the same as in dowear in do_wear.c
	 * except for the additional restriction on intelligence.  (Players
	 * are always intelligent, even if polymorphed).
	 */
	if (verysmall(mon->data) || nohands(mon->data) || is_animal(mon->data))
		return;
	/* give mummies a chance to wear their wrappings
	 * and let skeletons wear their initial armor */
	if (mindless(mon->data) && (!creation ||
	    (mon->data->mlet != S_MUMMY && mon->data != &mons[PM_SKELETON])))
		return;

	m_dowear_type(lev, mon, W_AMUL, creation, FALSE);
	/* can't put on shirt if already wearing suit */
	if (!cantweararm(mon->data) || (mon->misc_worn_check & W_ARM))
	    m_dowear_type(lev, mon, W_ARMU, creation, FALSE);
	/* treating small as a special case allows
	   hobbits, gnomes, and kobolds to wear cloaks */
	if (!cantweararm(mon->data) || mon->data->msize == MZ_SMALL)
	    m_dowear_type(lev, mon, W_ARMC, creation, FALSE);
	m_dowear_type(lev, mon, W_ARMH, creation, FALSE);
	/* Black Marketeer can use a shield even with two-handed Thiefbane. */
	if (!MON_WEP(mon) || !bimanual(MON_WEP(mon)) ||
	    mon->data == &mons[PM_BLACK_MARKETEER])
	    m_dowear_type(lev, mon, W_ARMS, creation, FALSE);
	m_dowear_type(lev, mon, W_ARMG, creation, FALSE);
	if (!slithy(mon->data) && mon->data->mlet != S_CENTAUR)
	    m_dowear_type(lev, mon, W_ARMF, creation, FALSE);
	if (!cantweararm(mon->data))
	    m_dowear_type(lev, mon, W_ARM, creation, FALSE);
	else
	    m_dowear_type(lev, mon, W_ARM, creation, RACE_EXCEPTION);
}